

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t charmap_ConvertNext(char **input,uint8_t **output)

{
  Charmap *pCVar1;
  uint8_t uVar2;
  char cVar3;
  Charmap *pCVar4;
  WarningID id;
  int iVar5;
  Charmap *pCVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  char *fmt;
  Charmap *pCVar10;
  uint8_t *puVar11;
  long lVar12;
  
  pCVar4 = *currentCharmap;
  pCVar1 = pCVar4 + 1;
  pcVar9 = *input;
  lVar8 = 0;
  pCVar6 = (Charmap *)0x0;
  pCVar10 = pCVar1;
  while ((*pcVar9 != '\0' && (sVar7 = (&pCVar10->usedNodes)[(byte)(*pcVar9 - 1)], sVar7 != 0))) {
    pcVar9 = pcVar9 + 1;
    *input = pcVar9;
    lVar8 = lVar8 + 1;
    lVar12 = sVar7 * 0x800;
    pCVar10 = (Charmap *)((long)pCVar1 + lVar12);
    if (*(char *)((long)pCVar1 + lVar12) != '\0') {
      lVar8 = 0;
      pCVar6 = pCVar10;
    }
  }
  pcVar9 = pcVar9 + -lVar8;
  *input = pcVar9;
  if (pCVar6 == (Charmap *)0x0) {
    cVar3 = *pcVar9;
    if (cVar3 == '\0') {
      sVar7 = 0;
    }
    else {
      if (output == (uint8_t **)0x0) {
        puVar11 = (uint8_t *)0x0;
      }
      else {
        puVar11 = *output;
      }
      sVar7 = readUTF8Char(puVar11,pcVar9);
      if (sVar7 == 0) {
        error("Input string is not valid UTF-8\n");
      }
      *input = *input + sVar7;
      if (output != (uint8_t **)0x0) {
        *output = *output + sVar7;
      }
      if (pCVar4->usedNodes < 2) {
        iVar5 = strcmp(pCVar4->name,"main");
        if (iVar5 == 0) {
          return sVar7;
        }
        pcVar9 = printChar((int)cVar3);
        fmt = "Unmapped character %s not in main charmap\n";
        id = WARNING_UNMAPPED_CHAR_2;
      }
      else {
        pcVar9 = printChar((int)cVar3);
        fmt = "Unmapped character %s\n";
        id = WARNING_UNMAPPED_CHAR_1;
      }
      warning(id,fmt,pcVar9);
    }
  }
  else {
    sVar7 = 1;
    if (output != (uint8_t **)0x0) {
      uVar2 = *(uint8_t *)((long)&pCVar6->name + 1);
      puVar11 = *output;
      *output = puVar11 + 1;
      *puVar11 = uVar2;
    }
  }
  return sVar7;
}

Assistant:

size_t charmap_ConvertNext(char const **input, uint8_t **output)
{
	// The goal is to match the longest mapping possible.
	// For that, advance through the trie with each character read.
	// If that would lead to a dead end, rewind characters until the last match, and output.
	// If no match, read a UTF-8 codepoint and output that.
	struct Charmap const *charmap = *currentCharmap;
	struct Charnode const *node = &charmap->nodes[0];
	struct Charnode const *match = NULL;
	size_t rewindDistance = 0;

	for (;;) {
		uint8_t c = **input - 1;

		if (**input && node->next[c]) {
			// Consume that char
			(*input)++;
			rewindDistance++;

			// Advance to next node (index starts at 1)
			node = &charmap->nodes[node->next[c]];
			if (node->isTerminal) {
				// This node matches, register it
				match = node;
				rewindDistance = 0; // If no longer match is found, rewind here
			}

		} else {
			// We are at a dead end (either because we reached the end of input, or of
			// the trie), so rewind up to the last match, and output.
			*input -= rewindDistance; // This will rewind all the way if no match found

			if (match) { // A match was found, use it
				if (output)
					*(*output)++ = match->value;

				return 1;

			} else if (**input) { // No match found, but there is some input left
				int firstChar = **input;
				// This will write the codepoint's value to `output`, little-endian
				size_t codepointLen = readUTF8Char(output ? *output : NULL,
								   *input);

				if (codepointLen == 0)
					error("Input string is not valid UTF-8\n");

				// OK because UTF-8 has no NUL in multi-byte chars
				*input += codepointLen;
				if (output)
					*output += codepointLen;

				// Warn if this character is not mapped but any others are
				if (charmap->usedNodes > 1)
					warning(WARNING_UNMAPPED_CHAR_1,
						"Unmapped character %s\n", printChar(firstChar));
				else if (strcmp(charmap->name, DEFAULT_CHARMAP_NAME))
					warning(WARNING_UNMAPPED_CHAR_2,
						"Unmapped character %s not in " DEFAULT_CHARMAP_NAME
						" charmap\n", printChar(firstChar));

				return codepointLen;

			} else { // End of input
				return 0;
			}
		}
	}
}